

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ConvertToHalfPass::GenConvert
          (ConvertToHalfPass *this,uint32_t *val_idp,uint32_t width,Instruction *inst)

{
  uint32_t uVar1;
  uint32_t type_id;
  DefUseManager *this_00;
  Instruction *pIVar2;
  InstructionBuilder builder;
  
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar2 = analysis::DefUseManager::GetDef(this_00,*val_idp);
  uVar1 = Instruction::type_id(pIVar2);
  type_id = EquivFloatTypeId(this,uVar1,width);
  if (type_id != uVar1) {
    InstructionBuilder::InstructionBuilder
              (&builder,(this->super_Pass).context_,inst,kAnalysisInstrToBlockMapping|kAnalysisBegin
              );
    if (pIVar2->opcode_ == OpUndef) {
      pIVar2 = InstructionBuilder::AddNullaryOp(&builder,type_id,OpUndef);
    }
    else {
      pIVar2 = InstructionBuilder::AddUnaryOp(&builder,type_id,OpFConvert,*val_idp);
    }
    uVar1 = Instruction::result_id(pIVar2);
    *val_idp = uVar1;
  }
  return;
}

Assistant:

void ConvertToHalfPass::GenConvert(uint32_t* val_idp, uint32_t width,
                                   Instruction* inst) {
  Instruction* val_inst = get_def_use_mgr()->GetDef(*val_idp);
  uint32_t ty_id = val_inst->type_id();
  uint32_t nty_id = EquivFloatTypeId(ty_id, width);
  if (nty_id == ty_id) return;
  Instruction* cvt_inst;
  InstructionBuilder builder(
      context(), inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  if (val_inst->opcode() == spv::Op::OpUndef)
    cvt_inst = builder.AddNullaryOp(nty_id, spv::Op::OpUndef);
  else
    cvt_inst = builder.AddUnaryOp(nty_id, spv::Op::OpFConvert, *val_idp);
  *val_idp = cvt_inst->result_id();
}